

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2f151d::InitListExpr::printLeft(InitListExpr *this,OutputStream *S)

{
  OutputStream *S_local;
  InitListExpr *this_local;
  
  if (this->Ty != (Node *)0x0) {
    Node::print(this->Ty,S);
  }
  OutputStream::operator+=(S,'{');
  NodeArray::printWithComma(&this->Inits,S);
  OutputStream::operator+=(S,'}');
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Ty)
      Ty->print(S);
    S += '{';
    Inits.printWithComma(S);
    S += '}';
  }